

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

void unknown_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char cVar1;
  byte *pbVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  int c;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char buf [4];
  char local_3c [4];
  ENCODING *local_38;
  
  local_38 = enc;
  pcVar7 = fromLim;
  do {
    pbVar2 = (byte *)*fromP;
    bVar4 = true;
    if (pbVar2 != (byte *)fromLim) {
      pcVar8 = (char *)((long)enc[6].literalScanners + (ulong)*pbVar2 * 4 + 0x69);
      uVar5 = (uint)pcVar8[-1];
      if (pcVar8[-1] == '\0') {
        c = (*local_38[3].literalScanners[1])
                      ((ENCODING *)local_38[3].sameName,(char *)pbVar2,pcVar7,(char **)0x2);
        uVar5 = cm_expat_XmlUtf8Encode(c,local_3c);
        pcVar7 = (char *)(ulong)uVar5;
        bVar4 = true;
        if ((long)pcVar7 <= (long)toLim - (long)*toP) {
          *fromP = *fromP + ((ulong)*(byte *)((long)local_38[1].scanners + (ulong)(byte)**fromP) - 3
                            );
          pcVar8 = local_3c;
          goto LAB_004dd65a;
        }
      }
      else {
        pcVar7 = (char *)(long)(int)uVar5;
        if ((long)pcVar7 <= (long)toLim - (long)*toP) {
          *fromP = (char *)(pbVar2 + 1);
LAB_004dd65a:
          lVar6 = 0;
          do {
            cVar1 = pcVar8[lVar6];
            pcVar7 = (char *)CONCAT71((int7)((ulong)pcVar7 >> 8),cVar1);
            pcVar3 = *toP;
            *toP = pcVar3 + 1;
            *pcVar3 = cVar1;
            lVar6 = lVar6 + 1;
          } while (uVar5 != (uint)lVar6);
          bVar4 = false;
        }
      }
    }
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

static
void unknown_toUtf8(const ENCODING *enc,
                    const char **fromP, const char *fromLim,
                    char **toP, const char *toLim)
{
  char buf[XML_UTF8_ENCODE_MAX];
  for (;;) {
    const char *utf8;
    int n;
    if (*fromP == fromLim)
      break;
    utf8 = ((const struct unknown_encoding *)enc)->utf8[(unsigned char)**fromP];
    n = *utf8++;
    if (n == 0) {
      int c = ((const struct unknown_encoding *)enc)
              ->convert(((const struct unknown_encoding *)enc)->userData, *fromP);
      n = XmlUtf8Encode(c, buf);
      if (n > toLim - *toP)
        break;
      utf8 = buf;
      *fromP += ((const struct normal_encoding *)enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2);
    }
    else {
      if (n > toLim - *toP)
        break;
      (*fromP)++;
    }
    do {
      *(*toP)++ = *utf8++;
    } while (--n != 0);
  }
}